

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

size_t __thiscall fmt::v9::detail::code_point_index(detail *this,string_view s,size_t n)

{
  size_t size;
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 0;
  pcVar3 = (char *)0x0;
  while ((pcVar1 = s.data_, s.data_ != pcVar3 &&
         (uVar2 = uVar2 + 1, pcVar1 = pcVar3, uVar2 <= s.size_))) {
    pcVar3 = pcVar3 + 1;
  }
  return (size_t)pcVar1;
}

Assistant:

inline auto code_point_index(string_view s, size_t n) -> size_t {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80 && ++num_code_points > n) return i;
  }
  return s.size();
}